

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

Vec_Bit_t * Acec_MultMarkPPs(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  bool bVar2;
  Vec_Bit_t *local_148;
  word Truth;
  int local_138;
  int nProds;
  int iObj;
  int i;
  Vec_Int_t *vSupp;
  Vec_Wrd_t *vTemp;
  Vec_Bit_t *vRes;
  word Saved [32];
  Gia_Man_t *p_local;
  
  memcpy(&vRes,&DAT_00d07de0,0x100);
  iVar1 = Gia_ManObjNum(p);
  vTemp = (Vec_Wrd_t *)Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  vSupp = (Vec_Int_t *)Vec_WrdStart(iVar1);
  _iObj = Vec_IntAlloc(100);
  Truth._4_4_ = 0;
  Gia_ManCleanMark0(p);
  local_138 = 0;
  do {
    if (p->nObjs <= local_138) {
      Gia_ManCleanMark0(p);
      printf("Collected %d pps.\n",(ulong)Truth._4_4_);
      Vec_IntFree(_iObj);
      Vec_WrdFree((Vec_Wrd_t *)vSupp);
      return (Vec_Bit_t *)vTemp;
    }
    pObj = Gia_ManObj(p,local_138);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_Var2Lit(local_138,0);
      local_148 = (Vec_Bit_t *)Gia_ObjComputeTruth6Cis(p,iVar1,_iObj,(Vec_Wrd_t *)vSupp);
      iVar1 = Vec_IntSize(_iObj);
      if (iVar1 < 7) {
        iVar1 = Abc_Tt6MinBase((word *)&local_148,_iObj->pArray,_iObj->nSize);
        _iObj->nSize = iVar1;
        iVar1 = Vec_IntSize(_iObj);
        if (iVar1 < 6) {
          nProds = 0;
          while( true ) {
            bVar2 = false;
            if (nProds < 0x20) {
              bVar2 = Saved[(long)nProds + -1] != 0;
            }
            if (!bVar2) goto LAB_00826a64;
            if ((local_148 == (Vec_Bit_t *)Saved[(long)nProds + -1]) ||
               (local_148 == (Vec_Bit_t *)(Saved[(long)nProds + -1] ^ 0xffffffffffffffff))) break;
            nProds = nProds + 1;
          }
          Vec_BitWriteEntry((Vec_Bit_t *)vTemp,local_138,1);
          Truth._4_4_ = Truth._4_4_ + 1;
        }
      }
    }
LAB_00826a64:
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

Vec_Bit_t * Acec_MultMarkPPs( Gia_Man_t * p )
{
    word Saved[32] = {
        ABC_CONST(0xF335ACC0F335ACC0),
        ABC_CONST(0x35C035C035C035C0),
        ABC_CONST(0xD728D728D728D728),
        ABC_CONST(0xFD80FD80FD80FD80),
        ABC_CONST(0xACC0ACC0ACC0ACC0),
        ABC_CONST(0x7878787878787878),
        ABC_CONST(0x2828282828282828),
        ABC_CONST(0xD0D0D0D0D0D0D0D0),
        ABC_CONST(0x8080808080808080),
        ABC_CONST(0x8888888888888888),
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0x5555555555555555),

        ABC_CONST(0xD5A8D5A8D5A8D5A8),
        ABC_CONST(0x2A572A572A572A57),
        ABC_CONST(0xF3C0F3C0F3C0F3C0),
        ABC_CONST(0x5858585858585858),
        ABC_CONST(0xA7A7A7A7A7A7A7A7),
        ABC_CONST(0x2727272727272727),
        ABC_CONST(0xD8D8D8D8D8D8D8D8)
    };

    Vec_Bit_t * vRes = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, iObj, nProds = 0;
    Gia_ManCleanMark0(p);
    Gia_ManForEachAndId( p, iObj )
    {
        word Truth = Gia_ObjComputeTruth6Cis( p, Abc_Var2Lit(iObj, 0), vSupp, vTemp );
        if ( Vec_IntSize(vSupp) > 6  )
            continue;
        vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
        if ( Vec_IntSize(vSupp) > 5  )
            continue;
        for ( i = 0; i < 32 && Saved[i]; i++ )
        {
            if ( Truth == Saved[i] || Truth == ~Saved[i] )
            {
                Vec_BitWriteEntry( vRes, iObj, 1 );
                nProds++;
                break;
            }
        }
    }
    Gia_ManCleanMark0(p);
    printf( "Collected %d pps.\n", nProds );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    return vRes;
}